

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabModuleUnref(sqlite3 *db,Module *pMod)

{
  Module *pMod_local;
  sqlite3 *db_local;
  
  pMod->nRefModule = pMod->nRefModule + -1;
  if (pMod->nRefModule == 0) {
    if (pMod->xDestroy != (_func_void_void_ptr *)0x0) {
      (*pMod->xDestroy)(pMod->pAux);
    }
    sqlite3DbFree(db,pMod);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabModuleUnref(sqlite3 *db, Module *pMod){
  assert( pMod->nRefModule>0 );
  pMod->nRefModule--;
  if( pMod->nRefModule==0 ){
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    assert( pMod->pEpoTab==0 );
    sqlite3DbFree(db, pMod);
  }
}